

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall
google::protobuf::FileDescriptorProto::SerializeWithCachedSizes
          (FileDescriptorProto *this,CodedOutputStream *output)

{
  uint uVar1;
  int iVar2;
  int size;
  uint uVar3;
  int32 iVar4;
  char *pcVar5;
  string *psVar6;
  DescriptorProto *value;
  EnumDescriptorProto *value_00;
  ServiceDescriptorProto *value_01;
  FieldDescriptorProto *value_02;
  UnknownFieldSet *unknown_fields;
  int local_70;
  int n_6;
  int i_6;
  int n_5;
  int i_5;
  uint n_4;
  uint i_4;
  uint n_3;
  uint i_3;
  uint n_2;
  uint i_2;
  uint n_1;
  uint i_1;
  int n;
  int i;
  uint32 cached_has_bits;
  CodedOutputStream *output_local;
  FileDescriptorProto *this_local;
  
  uVar1 = (this->_has_bits_).has_bits_[0];
  if ((uVar1 & 1) != 0) {
    name_abi_cxx11_(this);
    pcVar5 = (char *)std::__cxx11::string::data();
    name_abi_cxx11_(this);
    iVar2 = std::__cxx11::string::length();
    internal::WireFormat::VerifyUTF8StringNamedField
              (pcVar5,iVar2,SERIALIZE,"google.protobuf.FileDescriptorProto.name");
    psVar6 = name_abi_cxx11_(this);
    internal::WireFormatLite::WriteStringMaybeAliased(1,psVar6,output);
  }
  if ((uVar1 & 2) != 0) {
    package_abi_cxx11_(this);
    pcVar5 = (char *)std::__cxx11::string::data();
    package_abi_cxx11_(this);
    iVar2 = std::__cxx11::string::length();
    internal::WireFormat::VerifyUTF8StringNamedField
              (pcVar5,iVar2,SERIALIZE,"google.protobuf.FileDescriptorProto.package");
    psVar6 = package_abi_cxx11_(this);
    internal::WireFormatLite::WriteStringMaybeAliased(2,psVar6,output);
  }
  i_1 = 0;
  iVar2 = dependency_size(this);
  for (; (int)i_1 < iVar2; i_1 = i_1 + 1) {
    dependency_abi_cxx11_(this,i_1);
    pcVar5 = (char *)std::__cxx11::string::data();
    dependency_abi_cxx11_(this,i_1);
    size = std::__cxx11::string::length();
    internal::WireFormat::VerifyUTF8StringNamedField
              (pcVar5,size,SERIALIZE,"google.protobuf.FileDescriptorProto.dependency");
    psVar6 = dependency_abi_cxx11_(this,i_1);
    internal::WireFormatLite::WriteString(3,psVar6,output);
  }
  i_2 = 0;
  uVar3 = message_type_size(this);
  for (; i_2 < uVar3; i_2 = i_2 + 1) {
    value = message_type(this,i_2);
    internal::WireFormatLite::WriteMessageMaybeToArray(4,(MessageLite *)value,output);
  }
  i_3 = 0;
  uVar3 = enum_type_size(this);
  for (; i_3 < uVar3; i_3 = i_3 + 1) {
    value_00 = enum_type(this,i_3);
    internal::WireFormatLite::WriteMessageMaybeToArray(5,(MessageLite *)value_00,output);
  }
  i_4 = 0;
  uVar3 = service_size(this);
  for (; i_4 < uVar3; i_4 = i_4 + 1) {
    value_01 = service(this,i_4);
    internal::WireFormatLite::WriteMessageMaybeToArray(6,(MessageLite *)value_01,output);
  }
  i_5 = 0;
  uVar3 = extension_size(this);
  for (; (uint)i_5 < uVar3; i_5 = i_5 + 1) {
    value_02 = extension(this,i_5);
    internal::WireFormatLite::WriteMessageMaybeToArray(7,(MessageLite *)value_02,output);
  }
  if ((uVar1 & 8) != 0) {
    internal::WireFormatLite::WriteMessageMaybeToArray(8,(MessageLite *)this->options_,output);
  }
  if ((uVar1 & 0x10) != 0) {
    internal::WireFormatLite::WriteMessageMaybeToArray
              (9,(MessageLite *)this->source_code_info_,output);
  }
  i_6 = 0;
  iVar2 = public_dependency_size(this);
  for (; i_6 < iVar2; i_6 = i_6 + 1) {
    iVar4 = public_dependency(this,i_6);
    internal::WireFormatLite::WriteInt32(10,iVar4,output);
  }
  local_70 = 0;
  iVar2 = weak_dependency_size(this);
  for (; local_70 < iVar2; local_70 = local_70 + 1) {
    iVar4 = weak_dependency(this,local_70);
    internal::WireFormatLite::WriteInt32(0xb,iVar4,output);
  }
  if ((uVar1 & 4) != 0) {
    syntax_abi_cxx11_(this);
    pcVar5 = (char *)std::__cxx11::string::data();
    syntax_abi_cxx11_(this);
    iVar2 = std::__cxx11::string::length();
    internal::WireFormat::VerifyUTF8StringNamedField
              (pcVar5,iVar2,SERIALIZE,"google.protobuf.FileDescriptorProto.syntax");
    psVar6 = syntax_abi_cxx11_(this);
    internal::WireFormatLite::WriteStringMaybeAliased(0xc,psVar6,output);
  }
  if (((uint)(this->_internal_metadata_).
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_ & 1) == 1) {
    unknown_fields = FileDescriptorProto::unknown_fields(this);
    internal::WireFormat::SerializeUnknownFields(unknown_fields,output);
  }
  return;
}

Assistant:

void FileDescriptorProto::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:google.protobuf.FileDescriptorProto)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional string name = 1;
  if (cached_has_bits & 0x00000001u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->name().data(), this->name().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "google.protobuf.FileDescriptorProto.name");
    ::google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(
      1, this->name(), output);
  }

  // optional string package = 2;
  if (cached_has_bits & 0x00000002u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->package().data(), this->package().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "google.protobuf.FileDescriptorProto.package");
    ::google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(
      2, this->package(), output);
  }

  // repeated string dependency = 3;
  for (int i = 0, n = this->dependency_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->dependency(i).data(), this->dependency(i).length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "google.protobuf.FileDescriptorProto.dependency");
    ::google::protobuf::internal::WireFormatLite::WriteString(
      3, this->dependency(i), output);
  }

  // repeated .google.protobuf.DescriptorProto message_type = 4;
  for (unsigned int i = 0, n = this->message_type_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      4, this->message_type(i), output);
  }

  // repeated .google.protobuf.EnumDescriptorProto enum_type = 5;
  for (unsigned int i = 0, n = this->enum_type_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      5, this->enum_type(i), output);
  }

  // repeated .google.protobuf.ServiceDescriptorProto service = 6;
  for (unsigned int i = 0, n = this->service_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      6, this->service(i), output);
  }

  // repeated .google.protobuf.FieldDescriptorProto extension = 7;
  for (unsigned int i = 0, n = this->extension_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      7, this->extension(i), output);
  }

  // optional .google.protobuf.FileOptions options = 8;
  if (cached_has_bits & 0x00000008u) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      8, *this->options_, output);
  }

  // optional .google.protobuf.SourceCodeInfo source_code_info = 9;
  if (cached_has_bits & 0x00000010u) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      9, *this->source_code_info_, output);
  }

  // repeated int32 public_dependency = 10;
  for (int i = 0, n = this->public_dependency_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteInt32(
      10, this->public_dependency(i), output);
  }

  // repeated int32 weak_dependency = 11;
  for (int i = 0, n = this->weak_dependency_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteInt32(
      11, this->weak_dependency(i), output);
  }

  // optional string syntax = 12;
  if (cached_has_bits & 0x00000004u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->syntax().data(), this->syntax().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "google.protobuf.FileDescriptorProto.syntax");
    ::google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(
      12, this->syntax(), output);
  }

  if (_internal_metadata_.have_unknown_fields()) {
    ::google::protobuf::internal::WireFormat::SerializeUnknownFields(
        unknown_fields(), output);
  }
  // @@protoc_insertion_point(serialize_end:google.protobuf.FileDescriptorProto)
}